

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqbaselib.cpp
# Opt level: O2

SQInteger get_allowed_args_count(SQObject *closure,SQInteger num_supported)

{
  long lVar1;
  
  if (closure->_type == OT_NATIVECLOSURE) {
    lVar1 = ((closure->_unVal).pNativeClosure)->_nparamscheck;
    if (0 < lVar1) {
      num_supported = lVar1;
    }
    return num_supported;
  }
  if (closure->_type == OT_CLOSURE) {
    return ((closure->_unVal).pClosure)->_function->_nparameters;
  }
  return -1;
}

Assistant:

static SQInteger get_allowed_args_count(SQObject &closure, SQInteger num_supported)
{
    if(sq_type(closure) == OT_CLOSURE) {
        return _closure(closure)->_function->_nparameters;
    }
    else if (sq_type(closure) == OT_NATIVECLOSURE) {
        SQInteger nParamsCheck = _nativeclosure(closure)->_nparamscheck;
        if (nParamsCheck > 0)
            return nParamsCheck;
        else // push all params when there is no check or only minimal count set
            return num_supported;
    }
    assert(false);
    return -1;
}